

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O2

void ts_stack_delete(Stack *self)

{
  StackNodeArray *pool;
  uint32_t i;
  ulong uVar1;
  uint32_t i_1;
  long lVar2;
  
  if ((self->slices).contents != (StackSlice *)0x0) {
    array__delete((VoidArray *)&self->slices);
  }
  if ((self->iterators).contents != (StackIterator *)0x0) {
    array__delete((VoidArray *)&self->iterators);
  }
  pool = &self->node_pool;
  stack_node_release(self->base_node,pool,self->subtree_pool);
  lVar2 = 0;
  for (uVar1 = 0; uVar1 < (self->heads).size; uVar1 = uVar1 + 1) {
    stack_head_delete((StackHead *)((long)&((self->heads).contents)->node + lVar2),pool,
                      self->subtree_pool);
    lVar2 = lVar2 + 0x28;
  }
  (self->heads).size = 0;
  if ((self->node_pool).contents != (StackNode **)0x0) {
    for (uVar1 = 0; uVar1 < (self->node_pool).size; uVar1 = uVar1 + 1) {
      free(pool->contents[uVar1]);
    }
    array__delete((VoidArray *)pool);
  }
  array__delete((VoidArray *)self);
  free(self);
  return;
}

Assistant:

void ts_stack_delete(Stack *self) {
  if (self->slices.contents)
    array_delete(&self->slices);
  if (self->iterators.contents)
    array_delete(&self->iterators);
  stack_node_release(self->base_node, &self->node_pool, self->subtree_pool);
  for (uint32_t i = 0; i < self->heads.size; i++) {
    stack_head_delete(&self->heads.contents[i], &self->node_pool, self->subtree_pool);
  }
  array_clear(&self->heads);
  if (self->node_pool.contents) {
    for (uint32_t i = 0; i < self->node_pool.size; i++)
      ts_free(self->node_pool.contents[i]);
    array_delete(&self->node_pool);
  }
  array_delete(&self->heads);
  ts_free(self);
}